

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

bool google::protobuf::anon_unknown_0::IsMapFieldInApi(FieldDescriptor *field)

{
  bool bVar1;
  _func_void_FieldDescriptor_ptr *local_20;
  FieldDescriptor *local_18;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_18 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_20,&local_18);
  }
  if (*(int *)(field + 0x38) == 0xb) {
    bVar1 = FieldDescriptor::is_map_message_type(field);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsMapFieldInApi(const FieldDescriptor* field) { return field->is_map(); }